

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mipmapped_texture::qdxt_pack_init
          (mipmapped_texture *this,qdxt_state *state,mipmapped_texture *dst_tex,
          qdxt1_params *dxt1_params,qdxt5_params *dxt5_params,pixel_format fmt,bool cook)

{
  color_quad_u8 *pcVar1;
  mip_level *this_00;
  dxt_pixel_block *pdVar2;
  mip_desc *pmVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  image_u8 *other;
  uint *puVar9;
  color_quad<unsigned_char,_int> *pcVar10;
  char cVar11;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  uint by;
  uint uVar15;
  char cVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  color_quad_u8 *pDst_pixel;
  color_quad_u8 *pcVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  conversion_type local_13c;
  image_u8 tmp_img;
  image_u8 img;
  
  if ((this->m_faces).m_size == 0) {
    return false;
  }
  memcpy(&state->m_qdxt1_params,dxt1_params,0x630);
  memcpy(state->m_qdxt5_params,dxt5_params,0x62d);
  memcpy(state->m_qdxt5_params + 1,dxt5_params,0x62d);
  state->m_has_blocks[0] = false;
  state->m_has_blocks[1] = false;
  state->m_has_blocks[2] = false;
  if (fmt == PIXEL_FMT_ETC1) goto LAB_001259a3;
  if (fmt == PIXEL_FMT_DXT5A) {
    state->m_has_blocks[1] = true;
    state->m_qdxt5_params[0].m_comp_index = 3;
    cVar16 = '\x01';
    cVar11 = '\0';
    cVar4 = '\0';
    goto LAB_00125a77;
  }
  if (fmt == PIXEL_FMT_DXT5_CCxY) {
LAB_001259b8:
    state->m_has_blocks[0] = true;
    state->m_has_blocks[1] = true;
    (state->m_qdxt1_params).m_perceptual = false;
    (state->m_qdxt1_params).m_use_alpha_blocks = false;
  }
  else {
    if (fmt == PIXEL_FMT_ETC2) goto LAB_001259a3;
    if (fmt == PIXEL_FMT_3DC) {
      state->m_has_blocks[1] = true;
      state->m_has_blocks[2] = true;
      state->m_qdxt5_params[0].m_comp_index = 1;
      state->m_qdxt5_params[1].m_comp_index = 0;
LAB_00125a57:
      cVar11 = '\x01';
      cVar4 = '\0';
      cVar16 = '\x01';
      goto LAB_00125a77;
    }
    if ((fmt != PIXEL_FMT_DXT4) && (fmt != PIXEL_FMT_DXT5)) {
      if (fmt == PIXEL_FMT_DXT1A) {
        state->m_has_blocks[0] = true;
        (state->m_qdxt1_params).m_use_alpha_blocks = true;
      }
      else {
        if (fmt == PIXEL_FMT_ETC2A) {
LAB_001259a3:
          console::warning("mipmapped_texture::qdxt_pack_init: This method does not support ETCn");
          return false;
        }
        if (((fmt == PIXEL_FMT_DXT5_AGBR) || (fmt == PIXEL_FMT_DXT5_xGBR)) ||
           (fmt == PIXEL_FMT_DXT5_xGxR)) goto LAB_001259b8;
        if ((fmt == PIXEL_FMT_ETC1S) || (fmt == PIXEL_FMT_ETC2AS)) goto LAB_001259a3;
        if (fmt == PIXEL_FMT_DXN) {
          state->m_has_blocks[1] = true;
          state->m_has_blocks[2] = true;
          state->m_qdxt5_params[0].m_comp_index = 0;
          state->m_qdxt5_params[1].m_comp_index = 1;
          goto LAB_00125a57;
        }
        if (fmt != PIXEL_FMT_DXT1) {
          return false;
        }
        state->m_has_blocks[0] = true;
      }
      cVar4 = '\x01';
      cVar11 = '\0';
      cVar16 = '\0';
      goto LAB_00125a77;
    }
    state->m_has_blocks[0] = true;
    state->m_has_blocks[1] = true;
    (state->m_qdxt1_params).m_use_alpha_blocks = false;
  }
  state->m_qdxt5_params[0].m_comp_index = 3;
  cVar16 = '\x01';
  cVar11 = '\0';
  cVar4 = '\x01';
LAB_00125a77:
  bVar14 = cVar16 + cVar4 + cVar11;
  uVar18 = dxt1_params->m_progress_start;
  if (cVar4 != '\0') {
    (state->m_qdxt1_params).m_progress_start = uVar18;
    uVar6 = dxt1_params->m_progress_range / (uint)bVar14;
    (state->m_qdxt1_params).m_progress_range = uVar6;
    uVar18 = uVar18 + uVar6;
  }
  if (cVar16 != '\0') {
    state->m_qdxt5_params[0].m_progress_start = uVar18;
    uVar6 = dxt1_params->m_progress_range / (uint)bVar14;
    state->m_qdxt5_params[0].m_progress_range = uVar6;
    uVar18 = uVar18 + uVar6;
  }
  if (cVar11 != '\0') {
    state->m_qdxt5_params[1].m_progress_start = uVar18;
    state->m_qdxt5_params[1].m_progress_range = dxt1_params->m_progress_range - uVar18;
  }
  state->m_fmt = fmt;
  init(dst_tex,(EVP_PKEY_CTX *)(ulong)this->m_width);
  vector<crnlib::dxt_pixel_block>::resize(&state->m_pixel_blocks,0,false);
  if (cook) {
    local_13c = image_utils::get_conversion_type(true,fmt);
    if (((fmt == PIXEL_FMT_A8) || (fmt == PIXEL_FMT_DXT5A)) &&
       (bVar5 = pixel_format_helpers::has_alpha(this->m_format), !bVar5)) {
      local_13c = cConversion_Y_To_A;
    }
  }
  else {
    local_13c = cConversion_Invalid;
  }
  (state->m_qdxt1_params).m_num_mips = 0;
  state->m_qdxt5_params[0].m_num_mips = 0;
  state->m_qdxt5_params[1].m_num_mips = 0;
  uVar6 = (this->m_faces).m_size;
  for (uVar17 = 0; uVar17 < uVar6; uVar17 = uVar17 + 1) {
    uVar19 = 0;
    uVar7 = 1;
    while( true ) {
      if (uVar7 == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = (ulong)((this->m_faces).m_p)->m_size;
      }
      if (uVar12 <= uVar19) break;
      this_00 = (this->m_faces).m_p[uVar17].m_p[uVar19];
      (dst_tex->m_faces).m_p[uVar17].m_p[uVar19]->m_orient_flags = this_00->m_orient_flags;
      tmp_img.m_width = 0;
      tmp_img.m_height = 0;
      tmp_img.m_pitch = 0;
      tmp_img.m_total = 0;
      tmp_img.m_comp_flags = 0xf;
      tmp_img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
      tmp_img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
      tmp_img.m_pixel_buf.m_size = 0;
      tmp_img.m_pixel_buf.m_capacity = 0;
      other = mip_level::get_unpacked_image(this_00,&tmp_img,1);
      image<crnlib::color_quad<unsigned_char,_int>_>::image(&img,other);
      if (local_13c != cConversion_Invalid) {
        image_utils::convert_image(&img,local_13c);
      }
      uVar22 = img.m_width + 3 >> 2;
      uVar23 = img.m_height + 3 >> 2;
      uVar6 = (state->m_pixel_blocks).m_size;
      vector<crnlib::dxt_pixel_block>::resize(&state->m_pixel_blocks,uVar23 * uVar22 + uVar6,false);
      pdVar2 = (state->m_pixel_blocks).m_p;
      uVar7 = (state->m_qdxt1_params).m_num_mips;
      (state->m_qdxt1_params).m_mip_desc[uVar7].m_first_block = uVar6;
      pmVar3 = (state->m_qdxt1_params).m_mip_desc + uVar7;
      pmVar3->m_block_width = uVar22;
      pmVar3->m_block_height = uVar23;
      (state->m_qdxt1_params).m_num_mips = uVar7 + 1;
      lVar13 = 2;
      puVar9 = &state->m_qdxt5_params[0].m_num_mips;
      while (bVar5 = lVar13 != 0, lVar13 = lVar13 + -1, bVar5) {
        uVar7 = *puVar9;
        puVar9[(ulong)uVar7 * 3 + 1] = uVar6;
        *(ulong *)(puVar9 + (ulong)uVar7 * 3 + 2) = CONCAT44(uVar23,uVar22);
        *puVar9 = uVar7 + 1;
        puVar9 = puVar9 + 0x18c;
      }
      pcVar20 = (color_quad_u8 *)(pdVar2 + uVar6);
      for (uVar6 = 0; uVar6 != uVar23; uVar6 = uVar6 + 1) {
        iVar8 = 0;
        for (uVar7 = 0; uVar7 != uVar22; uVar7 = uVar7 + 1) {
          pcVar1 = pcVar20 + 0x10;
          for (uVar15 = 0; uVar15 != 4; uVar15 = uVar15 + 1) {
            for (iVar21 = 0; iVar21 != 4; iVar21 = iVar21 + 1) {
              pcVar10 = image<crnlib::color_quad<unsigned_char,_int>_>::get_clamped
                                  (&img,iVar8 + iVar21,uVar15 | uVar6 * 4);
              (((color_quad_u8 *)&(pcVar20->field_0).field_0.r)->field_0).field_0.r =
                   (pcVar10->field_0).field_0.r;
              (pcVar20->field_0).field_0.g = (pcVar10->field_0).field_0.g;
              (pcVar20->field_0).field_0.b = (pcVar10->field_0).field_0.b;
              (pcVar20->field_0).field_0.a = (pcVar10->field_0).field_0.a;
              pcVar20 = pcVar20 + 1;
            }
          }
          iVar8 = iVar8 + 4;
          pcVar20 = pcVar1;
        }
      }
      vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&img.m_pixel_buf);
      vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&tmp_img.m_pixel_buf);
      uVar19 = uVar19 + 1;
      uVar6 = (this->m_faces).m_size;
      uVar7 = uVar6;
    }
  }
  if (((state->m_has_blocks[0] == false) ||
      (iVar8 = qdxt1::init(&state->m_qdxt1,(EVP_PKEY_CTX *)(ulong)(state->m_pixel_blocks).m_size),
      (char)iVar8 != '\0')) &&
     (((state->m_has_blocks[1] != true ||
       (iVar8 = qdxt5::init(&state->m_qdxt5a,(EVP_PKEY_CTX *)(ulong)(state->m_pixel_blocks).m_size),
       (char)iVar8 != '\0')) &&
      ((state->m_has_blocks[2] != true ||
       (iVar8 = qdxt5::init(&state->m_qdxt5b,(EVP_PKEY_CTX *)(ulong)(state->m_pixel_blocks).m_size),
       (char)iVar8 != '\0')))))) {
    return true;
  }
  return false;
}

Assistant:

bool mipmapped_texture::qdxt_pack_init(qdxt_state& state, mipmapped_texture& dst_tex, const qdxt1_params& dxt1_params, const qdxt5_params& dxt5_params, pixel_format fmt, bool cook) {
  if (!is_valid())
    return false;

  state.m_qdxt1_params = dxt1_params;
  state.m_qdxt5_params[0] = dxt5_params;
  state.m_qdxt5_params[1] = dxt5_params;
  utils::zero_object(state.m_has_blocks);

  switch (fmt) {
    case PIXEL_FMT_DXT1: {
      state.m_has_blocks[0] = true;
      break;
    }
    case PIXEL_FMT_DXT1A: {
      state.m_has_blocks[0] = true;
      state.m_qdxt1_params.m_use_alpha_blocks = true;
      break;
    }
    case PIXEL_FMT_DXT4:
    case PIXEL_FMT_DXT5: {
      state.m_has_blocks[0] = true;
      state.m_has_blocks[1] = true;
      state.m_qdxt1_params.m_use_alpha_blocks = false;
      state.m_qdxt5_params[0].m_comp_index = 3;
      break;
    }
    case PIXEL_FMT_DXT5_CCxY:
    case PIXEL_FMT_DXT5_xGxR:
    case PIXEL_FMT_DXT5_xGBR:
    case PIXEL_FMT_DXT5_AGBR: {
      state.m_has_blocks[0] = true;
      state.m_has_blocks[1] = true;
      state.m_qdxt1_params.m_use_alpha_blocks = false;
      state.m_qdxt1_params.m_perceptual = false;
      state.m_qdxt5_params[0].m_comp_index = 3;
      break;
    }
    case PIXEL_FMT_3DC: {
      state.m_has_blocks[1] = true;
      state.m_has_blocks[2] = true;
      state.m_qdxt5_params[0].m_comp_index = 1;
      state.m_qdxt5_params[1].m_comp_index = 0;
      break;
    }
    case PIXEL_FMT_DXN: {
      state.m_has_blocks[1] = true;
      state.m_has_blocks[2] = true;
      state.m_qdxt5_params[0].m_comp_index = 0;
      state.m_qdxt5_params[1].m_comp_index = 1;
      break;
    }
    case PIXEL_FMT_DXT5A: {
      state.m_has_blocks[1] = true;
      state.m_qdxt5_params[0].m_comp_index = 3;
      break;
    }
    case PIXEL_FMT_ETC1:
    case PIXEL_FMT_ETC2:
    case PIXEL_FMT_ETC2A:
    case PIXEL_FMT_ETC1S:
    case PIXEL_FMT_ETC2AS: {
      console::warning("mipmapped_texture::qdxt_pack_init: This method does not support ETCn");
      return false;
    }
    default: {
      CRNLIB_ASSERT(0);
      return false;
    }
  }

  const uint num_elements = state.m_has_blocks[0] + state.m_has_blocks[1] + state.m_has_blocks[2];

  uint cur_progress_start = dxt1_params.m_progress_start;
  if (state.m_has_blocks[0]) {
    state.m_qdxt1_params.m_progress_start = cur_progress_start;
    state.m_qdxt1_params.m_progress_range = dxt1_params.m_progress_range / num_elements;
    cur_progress_start += state.m_qdxt1_params.m_progress_range;
  }

  if (state.m_has_blocks[1]) {
    state.m_qdxt5_params[0].m_progress_start = cur_progress_start;
    state.m_qdxt5_params[0].m_progress_range = dxt1_params.m_progress_range / num_elements;
    cur_progress_start += state.m_qdxt5_params[0].m_progress_range;
  }

  if (state.m_has_blocks[2]) {
    state.m_qdxt5_params[1].m_progress_start = cur_progress_start;
    state.m_qdxt5_params[1].m_progress_range = dxt1_params.m_progress_range - cur_progress_start;
  }

  state.m_fmt = fmt;

  dst_tex.init(get_width(), get_height(), get_num_levels(), get_num_faces(), fmt, get_name().get_ptr(), cDefaultOrientationFlags);

  state.m_pixel_blocks.resize(0);

  image_utils::conversion_type cook_conv_type = image_utils::cConversion_Invalid;
  if (cook) {
    cook_conv_type = image_utils::get_conversion_type(true, fmt);
    if (pixel_format_helpers::is_alpha_only(fmt) && !pixel_format_helpers::has_alpha(m_format))
      cook_conv_type = image_utils::cConversion_Y_To_A;
  }

  state.m_qdxt1_params.m_num_mips = 0;
  state.m_qdxt5_params[0].m_num_mips = 0;
  state.m_qdxt5_params[1].m_num_mips = 0;

  for (uint f = 0; f < get_num_faces(); f++) {
    for (uint l = 0; l < get_num_levels(); l++) {
      mip_level* pLevel = get_level(f, l);

      dst_tex.get_level(f, l)->set_orientation_flags(pLevel->get_orientation_flags());

      image_u8 tmp_img;
      image_u8 img(*pLevel->get_unpacked_image(tmp_img, cUnpackFlagUncook));

      if (cook_conv_type != image_utils::cConversion_Invalid)
        image_utils::convert_image(img, cook_conv_type);

      const uint num_blocks_x = (img.get_width() + 3) / 4;
      const uint num_blocks_y = (img.get_height() + 3) / 4;
      const uint total_blocks = num_blocks_x * num_blocks_y;

      const uint cur_size = state.m_pixel_blocks.size();
      state.m_pixel_blocks.resize(cur_size + total_blocks);
      dxt_pixel_block* pDst_blocks = &state.m_pixel_blocks[cur_size];

      {
        CRNLIB_ASSERT(state.m_qdxt1_params.m_num_mips < qdxt1_params::cMaxMips);
        qdxt1_params::mip_desc& mip_desc = state.m_qdxt1_params.m_mip_desc[state.m_qdxt1_params.m_num_mips];
        mip_desc.m_first_block = cur_size;
        mip_desc.m_block_width = num_blocks_x;
        mip_desc.m_block_height = num_blocks_y;
        state.m_qdxt1_params.m_num_mips++;
      }

      for (uint i = 0; i < 2; i++) {
        CRNLIB_ASSERT(state.m_qdxt5_params[i].m_num_mips < qdxt5_params::cMaxMips);
        qdxt5_params::mip_desc& mip_desc = state.m_qdxt5_params[i].m_mip_desc[state.m_qdxt5_params[i].m_num_mips];
        mip_desc.m_first_block = cur_size;
        mip_desc.m_block_width = num_blocks_x;
        mip_desc.m_block_height = num_blocks_y;
        state.m_qdxt5_params[i].m_num_mips++;
      }

      for (uint block_y = 0; block_y < num_blocks_y; block_y++) {
        const uint img_y = block_y << 2;

        for (uint block_x = 0; block_x < num_blocks_x; block_x++) {
          const uint img_x = block_x << 2;

          color_quad_u8* pDst_pixel = &pDst_blocks->m_pixels[0][0];

          pDst_blocks++;

          for (uint by = 0; by < 4; by++)
            for (uint bx = 0; bx < 4; bx++)
              *pDst_pixel++ = img.get_clamped(img_x + bx, img_y + by);
        }  // block_x
      }    // block_y
    }      // l
  }        // f

  if (state.m_has_blocks[0]) {
    if (!state.m_qdxt1.init(state.m_pixel_blocks.size(), &state.m_pixel_blocks[0], state.m_qdxt1_params))
      return false;
  }

  if (state.m_has_blocks[1]) {
    if (!state.m_qdxt5a.init(state.m_pixel_blocks.size(), &state.m_pixel_blocks[0], state.m_qdxt5_params[0]))
      return false;
  }

  if (state.m_has_blocks[2]) {
    if (!state.m_qdxt5b.init(state.m_pixel_blocks.size(), &state.m_pixel_blocks[0], state.m_qdxt5_params[1]))
      return false;
  }

  return true;
}